

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O1

bool __thiscall testing::internal::FilePath::IsDirectory(FilePath *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (this->pathname_).c_str_;
  sVar2 = (this->pathname_).length_;
  if (pcVar1 != (char *)0x0 && sVar2 == 0) {
    return false;
  }
  return pcVar1[sVar2 - 1] == '/';
}

Assistant:

const char* c_str() const { return c_str_; }